

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder__on_seek_memory(ma_decoder *pDecoder,ma_int64 byteOffset,ma_seek_origin origin)

{
  ma_seek_origin origin_local;
  ma_int64 byteOffset_local;
  ma_decoder *pDecoder_local;
  
  byteOffset_local = byteOffset;
  if (origin == ma_seek_origin_current) {
    if (byteOffset < 1) {
      if ((pDecoder->data).memory.currentReadPos < (ulong)-byteOffset) {
        byteOffset_local = -(pDecoder->data).memory.currentReadPos;
      }
      (pDecoder->data).memory.currentReadPos =
           (pDecoder->data).memory.currentReadPos + byteOffset_local;
    }
    else {
      if ((pDecoder->data).vfs.file <
          (ma_vfs_file)((pDecoder->data).memory.currentReadPos + byteOffset)) {
        byteOffset_local = (long)(pDecoder->data).vfs.file - (pDecoder->data).memory.currentReadPos;
      }
      (pDecoder->data).memory.currentReadPos =
           byteOffset_local + (pDecoder->data).memory.currentReadPos;
    }
  }
  else if (origin == ma_seek_origin_end) {
    if (byteOffset < 0) {
      byteOffset_local = -byteOffset;
    }
    if ((long)(pDecoder->data).vfs.file < byteOffset_local) {
      (pDecoder->data).memory.currentReadPos = 0;
    }
    else {
      (pDecoder->data).memory.currentReadPos = (long)(pDecoder->data).vfs.file - byteOffset_local;
    }
  }
  else if ((pDecoder->data).vfs.file < (ulong)byteOffset) {
    (pDecoder->data).memory.currentReadPos = (size_t)(pDecoder->data).vfs.file;
  }
  else {
    (pDecoder->data).memory.currentReadPos = byteOffset;
  }
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_decoder__on_seek_memory(ma_decoder* pDecoder, ma_int64 byteOffset, ma_seek_origin origin)
{
    if (byteOffset > 0 && (ma_uint64)byteOffset > MA_SIZE_MAX) {
        return MA_BAD_SEEK;
    }

    if (origin == ma_seek_origin_current) {
        if (byteOffset > 0) {
            if (pDecoder->data.memory.currentReadPos + byteOffset > pDecoder->data.memory.dataSize) {
                byteOffset = (ma_int64)(pDecoder->data.memory.dataSize - pDecoder->data.memory.currentReadPos);  /* Trying to seek too far forward. */
            }

            pDecoder->data.memory.currentReadPos += (size_t)byteOffset;
        } else {
            if (pDecoder->data.memory.currentReadPos < (size_t)-byteOffset) {
                byteOffset = -(ma_int64)pDecoder->data.memory.currentReadPos;  /* Trying to seek too far backwards. */
            }

            pDecoder->data.memory.currentReadPos -= (size_t)-byteOffset;
        }
    } else {
        if (origin == ma_seek_origin_end) {
            if (byteOffset < 0) {
                byteOffset = -byteOffset;
            }

            if (byteOffset > (ma_int64)pDecoder->data.memory.dataSize) {
                pDecoder->data.memory.currentReadPos = 0;   /* Trying to seek too far back. */
            } else {
                pDecoder->data.memory.currentReadPos = pDecoder->data.memory.dataSize - (size_t)byteOffset;
            }
        } else {
            if ((size_t)byteOffset <= pDecoder->data.memory.dataSize) {
                pDecoder->data.memory.currentReadPos = (size_t)byteOffset;
            } else {
                pDecoder->data.memory.currentReadPos = pDecoder->data.memory.dataSize;  /* Trying to seek too far forward. */
            }
        }
    }

    return MA_SUCCESS;
}